

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O2

void __thiscall
mp::ConstraintManager::FillConstraintCounters
          (ConstraintManager *this,BasicFlatModelAPI *mapi,FlatModelInfo *fmi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  
  (*fmi->_vptr_FlatModelInfo[0xb])(fmi);
  for (p_Var6 = (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->con_keepers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    uVar4 = (**(code **)(*(long *)p_Var6[1]._M_parent + 0xa0))();
    uVar5 = (**(code **)(*(long *)p_Var6[1]._M_parent + 0xe0))();
    uVar1 = (**(code **)(*(long *)p_Var6[1]._M_parent + 0xa8))(p_Var6[1]._M_parent,mapi);
    uVar2 = (**(code **)(*(long *)p_Var6[1]._M_parent + 0x18))();
    uVar3 = (**(code **)(*(long *)p_Var6[1]._M_parent + 0xb0))();
    (*fmi->_vptr_FlatModelInfo[0xc])(fmi,uVar4,uVar5,(ulong)uVar1,(ulong)uVar2 & 0xff,(ulong)uVar3);
  }
  return;
}

Assistant:

void FillConstraintCounters(
      const BasicFlatModelAPI& mapi, FlatModelInfo& fmi) const {
    fmi.InitConstraintCount();
    for (const auto& ck: con_keepers_) {
      fmi.AddNumberOfConstraints(
          ck.second.GetTypeInfo(),
          ck.second.GetShortTypeName(),
          ck.second.GetConstraintGroup(mapi),
          ck.second.IsLogical(),
          ck.second.GetNumberOfAddable());
    }
  }